

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O2

void __thiscall shaping_clipper::set_oversample(shaping_clipper *this,int oversample)

{
  PFFFT_Setup *pPVar1;
  int iVar2;
  double dVar3;
  
  if (this->max_oversample < oversample) {
    oversample = this->max_oversample;
  }
  if (oversample < 2) {
    oversample = 1;
  }
  dVar3 = log2((double)oversample);
  iVar2 = 1 << ((byte)(int)dVar3 & 0x1f);
  if (iVar2 != this->oversample) {
    if (this->pffft_oversampled != (PFFFT_Setup *)0x0) {
      pffft_destroy_setup(this->pffft_oversampled);
      this->pffft_oversampled = (PFFFT_Setup *)0x0;
    }
    if (1 < iVar2) {
      pPVar1 = pffft_new_setup(this->size << ((byte)(int)dVar3 & 0x1f),PFFFT_REAL);
      this->pffft_oversampled = pPVar1;
    }
  }
  this->oversample = iVar2;
  return;
}

Assistant:

void shaping_clipper::set_oversample(int oversample) {
    oversample = std::max(1, std::min(this->max_oversample, oversample));
    oversample = 1 << (int)log2(oversample);
    if (oversample != this->oversample) {
        if (this->pffft_oversampled) {
            pffft_destroy_setup(this->pffft_oversampled);
            this->pffft_oversampled = NULL;
        }
        if (oversample > 1) {
            this->pffft_oversampled = pffft_new_setup(this->size * oversample, PFFFT_REAL);
        }
    }
    this->oversample = oversample;
}